

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

int __thiscall
ON_HatchPattern::SetHatchLines(ON_HatchPattern *this,size_t count,ON_HatchLine *lines)

{
  HatchFillType type;
  
  if (lines == (ON_HatchLine *)0x0 || count == 0) {
    if ((this->m_lines).m_count != 0) {
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    }
    ON_ClassArray<ON_HatchLine>::Destroy(&this->m_lines);
    type = Solid;
    if (this->m_type != Lines) goto LAB_004b4f8f;
  }
  else {
    if (-1 < (this->m_lines).m_capacity) {
      (this->m_lines).m_count = 0;
    }
    ON_ClassArray<ON_HatchLine>::Append(&this->m_lines,(int)count,lines);
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    type = Lines;
  }
  SetFillType(this,type);
LAB_004b4f8f:
  return (this->m_lines).m_count;
}

Assistant:

int ON_HatchPattern::SetHatchLines(
  size_t count,
  const ON_HatchLine* lines
  )
{

  if (count > 0 && nullptr != lines )
  {
    m_lines.SetCount(0);
    m_lines.Append((int)count, lines);
    IncrementContentVersionNumber();
    SetFillType(ON_HatchPattern::HatchFillType::Lines);
  }
  else
  {
    if (0 != m_lines.UnsignedCount())
      IncrementContentVersionNumber();
    m_lines.Destroy();
    if ( ON_HatchPattern::HatchFillType::Lines == FillType())
      SetFillType(ON_HatchPattern::HatchFillType::Solid);
  }
  return m_lines.Count();
}